

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManAreRebalance(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  int iVar1;
  Gia_PtrAre_t GVar2;
  uint uVar3;
  Gia_PtrAre_t GVar4;
  uint *puVar5;
  uint uVar6;
  uint *puVar7;
  
  if (((uint)*pRoot & 0x7fffffff) == 0) {
    __assert_fail("pRoot->nItem || pRoot->nPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x38c,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  uVar3 = p->nObjs;
  iVar1 = p->nObjPages;
  if (uVar3 == iVar1 << 0x14) {
    if (iVar1 == 0x800) {
      puts("ERA manager has run out of memory after allocating 2B internal nodes.");
      puVar5 = (uint *)0x0;
      goto LAB_00734f30;
    }
    puVar5 = (uint *)calloc(0x400000,4);
    p->nObjPages = iVar1 + 1;
    p->ppObjs[iVar1] = puVar5;
    uVar3 = uVar3 + (uVar3 == 0);
  }
  p->nObjs = uVar3 + 1;
  puVar5 = (uint *)((ulong)((uVar3 & 0xfffff) << 4) +
                   *(long *)((long)p->ppObjs + (ulong)(uVar3 >> 0x11 & 0x3ff8)));
LAB_00734f30:
  uVar3 = Gia_ManAreFindBestVar(p,*pRoot);
  uVar3 = *puVar5 & 0xffffc000 | uVar3 & 0x3fff;
  *puVar5 = uVar3;
  GVar4 = *pRoot;
  puVar7 = (uint *)((ulong)((uint)GVar4 & 0xfffff) * (long)p->nSize * 4 +
                   *(long *)((long)p->ppStas + (ulong)((uint)GVar4 >> 0x11 & 0x3ff8)));
  if (*p->ppStas != puVar7) {
    do {
      GVar2 = *(Gia_PtrAre_t *)(puVar7 + 1);
      if (-1 < (int)*puVar7) {
        uVar6 = *(uint *)((long)puVar7 + (ulong)(uVar3 >> 2 & 0xffc) + 8);
        uVar3 = uVar3 * 2 & 0x1e;
        if ((uVar6 >> uVar3 & 1) == 0) {
          if ((uVar6 >> (sbyte)uVar3 & 2) != 0) {
            puVar7[1] = puVar5[2];
            *(Gia_PtrAre_t *)(puVar5 + 2) = GVar4;
            uVar6 = *puVar5 + 0x100000 & 0x3f00000;
            uVar3 = *puVar5 & 0xfc0fffff;
            goto LAB_00734ff5;
          }
          puVar7[1] = puVar5[3];
          *(Gia_PtrAre_t *)(puVar5 + 3) = GVar4;
          uVar3 = *puVar5 + 0x4000000;
        }
        else {
          puVar7[1] = puVar5[1];
          *(Gia_PtrAre_t *)(puVar5 + 1) = GVar4;
          uVar6 = *puVar5 + 0x4000 & 0xfc000;
          uVar3 = *puVar5 & 0xfff03fff;
LAB_00734ff5:
          uVar3 = uVar3 | uVar6;
        }
        *puVar5 = uVar3;
      }
      puVar7 = (uint *)((ulong)((uint)GVar2 & 0xfffff) * (long)p->nSize * 4 +
                       *(long *)((long)p->ppStas + (ulong)((uint)GVar2 >> 0x11 & 0x3ff8)));
      GVar4 = GVar2;
    } while (*p->ppStas != puVar7);
  }
  GVar4 = (Gia_PtrAre_t)(p->nObjs - 1);
  *pRoot = GVar4;
  if (puVar5 != (uint *)((ulong)(((uint)GVar4 & 0xfffff) << 4) +
                        *(long *)((long)p->ppObjs + (ulong)((uint)GVar4 >> 0x11 & 0x3ff8)))) {
    __assert_fail("pNode == Gia_ManAreObj(p, *pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x39d,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  p->fTree = 1;
  return;
}

Assistant:

static inline void Gia_ManAreRebalance( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_ObjAre_t * pNode;
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pNode = Gia_ManAreCreateObj( p );
    pNode->iVar = Gia_ManAreFindBestVar( p, *pRoot );
    for ( iCube = *pRoot, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext,  pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        if ( Gia_StaHasValue0(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[0], pNode->F[0] = iCube, pNode->nStas0++;
        else if ( Gia_StaHasValue1(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[1], pNode->F[1] = iCube, pNode->nStas1++;
        else
            pCube->iNext = pNode->F[2], pNode->F[2] = iCube, pNode->nStas2++;
    }
    *pRoot = Gia_Int2Ptr(p->nObjs - 1);
    assert( pNode == Gia_ManAreObj(p, *pRoot) );
    p->fTree = 1;
}